

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_blocked_sse41_128_16.c
# Opt level: O0

parasail_result_t *
parasail_sw_table_blocked_sse41_128_16
          (char *s1,int s1Len,char *s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  longlong lVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  unkuint10 Var10;
  undefined1 auVar11 [16];
  int iVar12;
  __m128i *ptr;
  __m128i *ptr_00;
  __m128i *ptr_01;
  int j_00;
  ushort uVar13;
  short sVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  short sVar19;
  ushort uVar21;
  short sVar22;
  short sVar23;
  ushort uVar24;
  short sVar25;
  short sVar26;
  ulong uVar20;
  ushort uVar27;
  short sVar28;
  short sVar29;
  __m128i vH_00;
  int32_t in_stack_fffffffffffffac8;
  undefined2 local_52c;
  __m128i *palStack_518;
  int16_t value;
  __m128i vT2;
  __m128i vT1;
  __m128i vE;
  __m128i vH;
  __m128i vP;
  __m128i *pvP;
  __m128i vF;
  __m128i vX;
  __m128i_16_t e;
  __m128i_16_t h;
  int local_46c;
  longlong lStack_468;
  int32_t index_1;
  __m128i_16_t t;
  parasail_result_t *ppStack_450;
  int32_t index;
  parasail_result_t *result;
  __m128i vMaxH;
  __m128i vNegInf;
  __m128i vZero;
  __m128i vGapE;
  __m128i vGapO;
  int local_3ec;
  int score;
  __m128i *pvE;
  __m128i *pvH;
  __m128i *vProfile;
  int32_t segLen;
  int32_t segWidth;
  int32_t n;
  int32_t segNum;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  int s1Len_local;
  char *s1_local;
  short local_268;
  short sStack_266;
  short sStack_264;
  short sStack_262;
  short sStack_260;
  short sStack_25e;
  short sStack_25c;
  short sStack_25a;
  short local_258;
  short sStack_256;
  short sStack_254;
  short sStack_250;
  short sStack_24e;
  short sStack_24c;
  short sStack_24a;
  short local_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  short sStack_210;
  short sStack_20e;
  short sStack_20c;
  short sStack_20a;
  short local_1b8;
  short sStack_1b6;
  short sStack_1b4;
  short sStack_1b2;
  short sStack_1b0;
  short sStack_1ae;
  short sStack_1ac;
  short sStack_1aa;
  short local_188;
  short sStack_186;
  short sStack_184;
  short sStack_182;
  short sStack_180;
  short sStack_17e;
  short sStack_17c;
  short sStack_17a;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  
  iVar12 = s1Len + 7;
  if (s1Len + 7 < 0) {
    iVar12 = s1Len + 0xe;
  }
  iVar12 = iVar12 >> 3;
  j_00 = gap;
  ptr = parasail_memalign___m128i(0x10,(long)(iVar12 * 0x18));
  ptr_00 = parasail_memalign___m128i(0x10,(long)iVar12);
  ptr_01 = parasail_memalign___m128i(0x10,(long)iVar12);
  local_3ec = -0x4000;
  i._0_2_ = (short)open;
  j._0_2_ = (short)gap;
  vMaxH[1] = -0x3fff3fff3fff4000;
  result = (parasail_result_t *)0x0;
  vMaxH[0] = 0;
  ppStack_450 = parasail_result_new_table1(iVar12 << 3,s2Len);
  t.m[1]._4_4_ = 0;
  for (n = 0; n < 0x18; n = n + 1) {
    for (k = 0; k < iVar12; k = k + 1) {
      segNum = k << 3;
      for (segWidth = 0; segWidth < 8; segWidth = segWidth + 1) {
        if (segNum < s1Len) {
          local_52c = (undefined2)matrix->matrix[matrix->size * matrix->mapper[(byte)s1[segNum]]];
        }
        else {
          local_52c = 0;
        }
        *(undefined2 *)((long)&stack0xfffffffffffffb98 + (long)segWidth * 2) = local_52c;
        segNum = segNum + 1;
      }
      ptr[(int)t.m[1]._4_4_][0] = lStack_468;
      ptr[(int)t.m[1]._4_4_][1] = t.m[0];
      t.m[1]._4_4_ = t.m[1]._4_4_ + 1;
    }
  }
  local_46c = 0;
  for (k = 0; k < iVar12; k = k + 1) {
    for (segWidth = 0; segWidth < 8; segWidth = segWidth + 1) {
      *(undefined2 *)((long)&e + (long)segWidth * 2 + 8) = 0;
      *(short *)((long)vX + (long)segWidth * 2 + 8) = -(short)i;
    }
    ptr_00[local_46c][0] = e.m[1];
    ptr_00[local_46c][1] = h.m[0];
    ptr_01[local_46c][0] = vX[1];
    ptr_01[local_46c][1] = e.m[0];
    local_46c = local_46c + 1;
  }
  for (segNum = 0; segNum < s2Len; segNum = segNum + 1) {
    vF[1] = 0;
    vX[0] = 0;
    vF[0] = 0xc000c000c000c000;
    pvP = (__m128i *)vMaxH[1];
    iVar1 = matrix->mapper[(byte)s2[segNum]];
    for (k = 0; k < iVar12; k = k + 1) {
      uVar2 = ptr_00[k][0];
      uVar3 = ptr_00[k][1];
      lVar4 = ptr_01[k][0];
      lVar5 = ptr_01[k][1];
      vE[1]._6_2_ = (ushort)(uVar2 >> 0x20);
      uVar20 = uVar3 << 0x10 | uVar2 >> 0x30 | vX[0];
      vX[0] = 0;
      lVar6 = ptr[(long)(iVar1 * iVar12) + (long)k][0];
      lVar7 = ptr[(long)(iVar1 * iVar12) + (long)k][1];
      local_258 = (short)vF[1];
      sStack_256 = (short)uVar2;
      sStack_254 = (short)(uVar2 >> 0x10);
      sStack_250 = (short)uVar20;
      sStack_24e = (short)(uVar20 >> 0x10);
      sStack_24c = (short)(uVar20 >> 0x20);
      sStack_24a = (short)(uVar20 >> 0x30);
      local_268 = (short)lVar6;
      sStack_266 = (short)((ulong)lVar6 >> 0x10);
      sStack_264 = (short)((ulong)lVar6 >> 0x20);
      sStack_262 = (short)((ulong)lVar6 >> 0x30);
      sStack_260 = (short)lVar7;
      sStack_25e = (short)((ulong)lVar7 >> 0x10);
      sStack_25c = (short)((ulong)lVar7 >> 0x20);
      sStack_25a = (short)((ulong)lVar7 >> 0x30);
      local_258 = local_258 + local_268;
      sStack_256 = sStack_256 + sStack_266;
      sStack_254 = sStack_254 + sStack_264;
      sStack_262 = vE[1]._6_2_ + sStack_262;
      sStack_250 = sStack_250 + sStack_260;
      sStack_24e = sStack_24e + sStack_25e;
      sStack_24c = sStack_24c + sStack_25c;
      sStack_24a = sStack_24a + sStack_25a;
      local_188 = (short)lVar4;
      sStack_186 = (short)((ulong)lVar4 >> 0x10);
      sStack_184 = (short)((ulong)lVar4 >> 0x20);
      sStack_182 = (short)((ulong)lVar4 >> 0x30);
      sStack_180 = (short)lVar5;
      sStack_17e = (short)((ulong)lVar5 >> 0x10);
      sStack_17c = (short)((ulong)lVar5 >> 0x20);
      sStack_17a = (short)((ulong)lVar5 >> 0x30);
      uVar13 = (ushort)(local_258 < local_188) * local_188 |
               (ushort)(local_258 >= local_188) * local_258;
      uVar15 = (ushort)(sStack_256 < sStack_186) * sStack_186 |
               (ushort)(sStack_256 >= sStack_186) * sStack_256;
      uVar16 = (ushort)(sStack_254 < sStack_184) * sStack_184 |
               (ushort)(sStack_254 >= sStack_184) * sStack_254;
      uVar17 = (ushort)(sStack_262 < sStack_182) * sStack_182 |
               (ushort)(sStack_262 >= sStack_182) * sStack_262;
      uVar18 = (ushort)(sStack_250 < sStack_180) * sStack_180 |
               (ushort)(sStack_250 >= sStack_180) * sStack_250;
      uVar21 = (ushort)(sStack_24e < sStack_17e) * sStack_17e |
               (ushort)(sStack_24e >= sStack_17e) * sStack_24e;
      uVar24 = (ushort)(sStack_24c < sStack_17c) * sStack_17c |
               (ushort)(sStack_24c >= sStack_17c) * sStack_24c;
      uVar27 = (ushort)(sStack_24a < sStack_17a) * sStack_17a |
               (ushort)(sStack_24a >= sStack_17a) * sStack_24a;
      vE[1]._0_2_ = (-1 < (short)uVar13) * uVar13;
      vE[1]._2_2_ = (-1 < (short)uVar15) * uVar15;
      vE[1]._4_2_ = (-1 < (short)uVar16) * uVar16;
      vE[1]._6_2_ = (-1 < (short)uVar17) * uVar17;
      vH[0]._0_2_ = (-1 < (short)uVar18) * uVar18;
      vH[0]._2_2_ = (-1 < (short)uVar21) * uVar21;
      vH[0]._4_2_ = (-1 < (short)uVar24) * uVar24;
      vH[0]._6_2_ = (-1 < (short)uVar27) * uVar27;
      sVar14 = pvP._14_2_ - (short)i;
      pvP._0_4_ = CONCAT22((ushort)vE[1] - (short)i,sVar14);
      pvP._0_6_ = CONCAT24(vE[1]._2_2_ - (short)i,pvP._0_4_);
      pvP = (__m128i *)CONCAT26(vE[1]._4_2_ - (short)i,pvP._0_6_);
      vF[0]._0_2_ = vE[1]._6_2_ - (short)i;
      vF[0]._2_2_ = (ushort)vH[0] - (short)i;
      vF[0]._4_2_ = vH[0]._2_2_ - (short)i;
      vF[0]._6_2_ = vH[0]._4_2_ - (short)i;
      uVar13 = -(ushort)(0 < (short)(vH[0]._4_2_ - (short)i));
      auVar9._2_2_ = -(ushort)(0 < (short)((ushort)vE[1] - (short)i));
      auVar9._0_2_ = -(ushort)(0 < sVar14);
      auVar9._4_2_ = -(ushort)(0 < (short)(vE[1]._2_2_ - (short)i));
      auVar9._6_2_ = -(ushort)(0 < (short)(vE[1]._4_2_ - (short)i));
      auVar9._8_2_ = -(ushort)(0 < (short)(vE[1]._6_2_ - (short)i));
      auVar9._10_2_ = -(ushort)(0 < (short)((ushort)vH[0] - (short)i));
      auVar9._12_2_ = -(ushort)(0 < (short)(vH[0]._2_2_ - (short)i));
      auVar9._14_2_ = uVar13;
      if ((((((((((((((((auVar9 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar9 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar9 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar9 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar9 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar9 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar9 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar9 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar9 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar9 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar9 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar9 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar9 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar9 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (uVar13 >> 7 & 1) == 0) && -1 < (short)uVar13) {
        Var10 = CONCAT82(CONCAT26(vH[0]._6_2_,
                                  CONCAT24(vH[0]._4_2_,CONCAT22(vH[0]._2_2_,(ushort)vH[0]))),
                         vE[1]._6_2_);
      }
      else {
        palStack_518 = pvP;
        vT2[0] = vF[0];
        while( true ) {
          local_98 = (short)palStack_518;
          sStack_96 = (short)((ulong)palStack_518 >> 0x10);
          sStack_94 = (short)((ulong)palStack_518 >> 0x20);
          sStack_92 = (short)((ulong)palStack_518 >> 0x30);
          sStack_90 = (short)vT2[0];
          sStack_8e = (short)((ulong)vT2[0] >> 0x10);
          sStack_8c = (short)((ulong)vT2[0] >> 0x20);
          sStack_8a = (short)((ulong)vT2[0] >> 0x30);
          uVar13 = -(ushort)(0 < sStack_8a);
          auVar8._2_2_ = -(ushort)(0 < sStack_96);
          auVar8._0_2_ = -(ushort)(0 < local_98);
          auVar8._4_2_ = -(ushort)(0 < sStack_94);
          auVar8._6_2_ = -(ushort)(0 < sStack_92);
          auVar8._8_2_ = -(ushort)(0 < sStack_90);
          auVar8._10_2_ = -(ushort)(0 < sStack_8e);
          auVar8._12_2_ = -(ushort)(0 < sStack_8c);
          auVar8._14_2_ = uVar13;
          local_1b8 = (short)pvP;
          sStack_1b6 = pvP._2_2_;
          sStack_1b4 = pvP._4_2_;
          sStack_1b2 = pvP._6_2_;
          sStack_1b0 = pvP._8_2_;
          sStack_1ae = pvP._10_2_;
          sStack_1ac = pvP._12_2_;
          sStack_1aa = pvP._14_2_;
          if ((((((((((((((((auVar8 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar8 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar8 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar8 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar8 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar8 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar8 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar8 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar8 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar8 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar8 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar8 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar8 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar8 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (uVar13 >> 7 & 1) == 0) && -1 < (short)uVar13) break;
          sVar14 = -(short)j;
          local_98 = local_98 - (short)j;
          sStack_96 = sStack_96 - (short)j;
          sStack_94 = sStack_94 - (short)j;
          sStack_92 = sStack_92 - (short)j;
          sStack_90 = sStack_90 - (short)j;
          sStack_8e = sStack_8e - (short)j;
          sStack_8c = sStack_8c - (short)j;
          palStack_518 = (__m128i *)
                         CONCAT26(sStack_94,CONCAT24(sStack_96,CONCAT22(local_98,sVar14)));
          vT2[0] = CONCAT26(sStack_8c,CONCAT24(sStack_8e,CONCAT22(sStack_90,sStack_92)));
          pvP._0_4_ = CONCAT22((ushort)(sStack_1b6 < local_98) * local_98 |
                               (ushort)(sStack_1b6 >= local_98) * sStack_1b6,
                               (ushort)(local_1b8 < sVar14) * sVar14 |
                               (ushort)(local_1b8 >= sVar14) * local_1b8);
          pvP._0_6_ = CONCAT24((ushort)(sStack_1b4 < sStack_96) * sStack_96 |
                               (ushort)(sStack_1b4 >= sStack_96) * sStack_1b4,pvP._0_4_);
          pvP = (__m128i *)
                CONCAT26((ushort)(sStack_1b2 < sStack_94) * sStack_94 |
                         (ushort)(sStack_1b2 >= sStack_94) * sStack_1b2,pvP._0_6_);
          vF[0]._0_2_ = (ushort)(sStack_1b0 < sStack_92) * sStack_92 |
                        (ushort)(sStack_1b0 >= sStack_92) * sStack_1b0;
          vF[0]._2_2_ = (ushort)(sStack_1ae < sStack_90) * sStack_90 |
                        (ushort)(sStack_1ae >= sStack_90) * sStack_1ae;
          vF[0]._4_2_ = (ushort)(sStack_1ac < sStack_8e) * sStack_8e |
                        (ushort)(sStack_1ac >= sStack_8e) * sStack_1ac;
          vF[0]._6_2_ = (ushort)(sStack_1aa < sStack_8c) * sStack_8c |
                        (ushort)(sStack_1aa >= sStack_8c) * sStack_1aa;
        }
        vE[1]._0_2_ = (ushort)((short)(ushort)vE[1] < local_1b8) * local_1b8 |
                      ((short)(ushort)vE[1] >= local_1b8) * (ushort)vE[1];
        vE[1]._2_2_ = (ushort)((short)vE[1]._2_2_ < sStack_1b6) * sStack_1b6 |
                      ((short)vE[1]._2_2_ >= sStack_1b6) * vE[1]._2_2_;
        vE[1]._4_2_ = (ushort)((short)vE[1]._4_2_ < sStack_1b4) * sStack_1b4 |
                      ((short)vE[1]._4_2_ >= sStack_1b4) * vE[1]._4_2_;
        vE[1]._6_2_ = (ushort)((short)vE[1]._6_2_ < sStack_1b2) * sStack_1b2 |
                      ((short)vE[1]._6_2_ >= sStack_1b2) * vE[1]._6_2_;
        vH[0]._0_2_ = (ushort)((short)(ushort)vH[0] < sStack_1b0) * sStack_1b0 |
                      ((short)(ushort)vH[0] >= sStack_1b0) * (ushort)vH[0];
        vH[0]._2_2_ = (ushort)((short)vH[0]._2_2_ < sStack_1ae) * sStack_1ae |
                      ((short)vH[0]._2_2_ >= sStack_1ae) * vH[0]._2_2_;
        vH[0]._4_2_ = (ushort)((short)vH[0]._4_2_ < sStack_1ac) * sStack_1ac |
                      ((short)vH[0]._4_2_ >= sStack_1ac) * vH[0]._4_2_;
        vH[0]._6_2_ = (ushort)((short)vH[0]._6_2_ < sStack_1aa) * sStack_1aa |
                      ((short)vH[0]._6_2_ >= sStack_1aa) * vH[0]._6_2_;
        sVar14 = (sStack_1b2 + (short)i) - (short)j;
        sVar19 = (sStack_1b0 + (short)i) - (short)j;
        sVar22 = (sStack_1ae + (short)i) - (short)j;
        sVar25 = (sStack_1ac + (short)i) - (short)j;
        sVar28 = (sStack_1aa + (short)i) - (short)j;
        Var10 = CONCAT28((ushort)((short)vH[0]._6_2_ < sVar28) * sVar28 |
                         ((short)vH[0]._6_2_ >= sVar28) * vH[0]._6_2_,
                         CONCAT26((ushort)((short)vH[0]._4_2_ < sVar25) * sVar25 |
                                  ((short)vH[0]._4_2_ >= sVar25) * vH[0]._4_2_,
                                  CONCAT24((ushort)((short)vH[0]._2_2_ < sVar22) * sVar22 |
                                           ((short)vH[0]._2_2_ >= sVar22) * vH[0]._2_2_,
                                           CONCAT22((ushort)((short)(ushort)vH[0] < sVar19) * sVar19
                                                    | ((short)(ushort)vH[0] >= sVar19) *
                                                      (ushort)vH[0],
                                                    (ushort)((short)vE[1]._6_2_ < sVar14) * sVar14 |
                                                    ((short)vE[1]._6_2_ >= sVar14) * vE[1]._6_2_))))
        ;
      }
      auVar11._10_6_ = 0;
      auVar11._0_10_ = Var10;
      _pvP = auVar11 << 0x30;
      ptr_00[k][0] = CONCAT26(vE[1]._6_2_,CONCAT24(vE[1]._4_2_,CONCAT22(vE[1]._2_2_,(ushort)vE[1])))
      ;
      ptr_00[k][1] = CONCAT26(vH[0]._6_2_,CONCAT24(vH[0]._4_2_,CONCAT22(vH[0]._2_2_,(ushort)vH[0])))
      ;
      vH_00[0] = (ulong)(uint)k;
      vH_00[1] = 8;
      arr_store_si128(((ppStack_450->field_4).rowcols)->score_row,vH_00,segNum,s2Len,j_00,
                      in_stack_fffffffffffffac8);
      local_218 = (short)result;
      sStack_216 = (short)((ulong)result >> 0x10);
      sStack_214 = (short)((ulong)result >> 0x20);
      sStack_212 = (short)((ulong)result >> 0x30);
      sStack_210 = (short)vMaxH[0];
      sStack_20e = (short)((ulong)vMaxH[0] >> 0x10);
      sStack_20c = (short)((ulong)vMaxH[0] >> 0x20);
      sStack_20a = (short)((ulong)vMaxH[0] >> 0x30);
      result = (parasail_result_t *)
               CONCAT26((sStack_212 < (short)vE[1]._6_2_) * vE[1]._6_2_ |
                        (ushort)(sStack_212 >= (short)vE[1]._6_2_) * sStack_212,
                        CONCAT24((sStack_214 < (short)vE[1]._4_2_) * vE[1]._4_2_ |
                                 (ushort)(sStack_214 >= (short)vE[1]._4_2_) * sStack_214,
                                 CONCAT22((sStack_216 < (short)vE[1]._2_2_) * vE[1]._2_2_ |
                                          (ushort)(sStack_216 >= (short)vE[1]._2_2_) * sStack_216,
                                          (local_218 < (short)(ushort)vE[1]) * (ushort)vE[1] |
                                          (ushort)(local_218 >= (short)(ushort)vE[1]) * local_218)))
      ;
      vMaxH[0] = CONCAT26((sStack_20a < (short)vH[0]._6_2_) * vH[0]._6_2_ |
                          (ushort)(sStack_20a >= (short)vH[0]._6_2_) * sStack_20a,
                          CONCAT24((sStack_20c < (short)vH[0]._4_2_) * vH[0]._4_2_ |
                                   (ushort)(sStack_20c >= (short)vH[0]._4_2_) * sStack_20c,
                                   CONCAT22((sStack_20e < (short)vH[0]._2_2_) * vH[0]._2_2_ |
                                            (ushort)(sStack_20e >= (short)vH[0]._2_2_) * sStack_20e,
                                            (sStack_210 < (short)(ushort)vH[0]) * (ushort)vH[0] |
                                            (ushort)(sStack_210 >= (short)(ushort)vH[0]) *
                                            sStack_210)));
      sVar14 = (ushort)vE[1] - (short)i;
      sVar19 = vE[1]._2_2_ - (short)i;
      sVar22 = vE[1]._4_2_ - (short)i;
      sVar25 = vE[1]._6_2_ - (short)i;
      sVar28 = (ushort)vH[0] - (short)i;
      sVar23 = vH[0]._2_2_ - (short)i;
      sVar26 = vH[0]._4_2_ - (short)i;
      sVar29 = vH[0]._6_2_ - (short)i;
      local_188 = local_188 - (short)j;
      sStack_186 = sStack_186 - (short)j;
      sStack_184 = sStack_184 - (short)j;
      sStack_182 = sStack_182 - (short)j;
      sStack_180 = sStack_180 - (short)j;
      sStack_17e = sStack_17e - (short)j;
      sStack_17c = sStack_17c - (short)j;
      sStack_17a = sStack_17a - (short)j;
      vT1[1] = CONCAT26((ushort)(sStack_182 < sVar25) * sVar25 |
                        (ushort)(sStack_182 >= sVar25) * sStack_182,
                        CONCAT24((ushort)(sStack_184 < sVar22) * sVar22 |
                                 (ushort)(sStack_184 >= sVar22) * sStack_184,
                                 CONCAT22((ushort)(sStack_186 < sVar19) * sVar19 |
                                          (ushort)(sStack_186 >= sVar19) * sStack_186,
                                          (ushort)(local_188 < sVar14) * sVar14 |
                                          (ushort)(local_188 >= sVar14) * local_188)));
      vE[0] = CONCAT26((ushort)(sStack_17a < sVar29) * sVar29 |
                       (ushort)(sStack_17a >= sVar29) * sStack_17a,
                       CONCAT24((ushort)(sStack_17c < sVar26) * sVar26 |
                                (ushort)(sStack_17c >= sVar26) * sStack_17c,
                                CONCAT22((ushort)(sStack_17e < sVar23) * sVar23 |
                                         (ushort)(sStack_17e >= sVar23) * sStack_17e,
                                         (ushort)(sStack_180 < sVar28) * sVar28 |
                                         (ushort)(sStack_180 >= sVar28) * sStack_180)));
      ptr_01[k][0] = vT1[1];
      ptr_01[k][1] = vE[0];
      vF[1] = uVar3 >> 0x30;
    }
  }
  for (segNum = 0; segNum < 8; segNum = segNum + 1) {
    if (local_3ec < vMaxH[0]._6_2_) {
      local_3ec = (int)vMaxH[0]._6_2_;
    }
    vMaxH[0] = vMaxH[0] << 0x10 | (ulong)result >> 0x30;
    result = (parasail_result_t *)((long)result << 0x10);
  }
  ppStack_450->score = local_3ec;
  ppStack_450->flag = ppStack_450->flag | 0x8202004;
  ppStack_450->flag = ppStack_450->flag | 0x20000;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  return ppStack_450;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict s1, const int s1Len,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    const int32_t n = 24; /* number of amino acids in table */
    const int32_t segWidth = 8; /* number of values in vector unit */
    const int32_t segLen = (s1Len + segWidth - 1) / segWidth;
    __m128i* const restrict vProfile = parasail_memalign___m128i(16, n * segLen);
    __m128i* restrict pvH = parasail_memalign___m128i(16, segLen);
    __m128i* const restrict pvE = parasail_memalign___m128i(16, segLen);
    int score = NEG_INF_16;
    __m128i vGapO = _mm_set1_epi16(open);
    __m128i vGapE = _mm_set1_epi16(gap);
    __m128i vZero = _mm_setzero_si128();
    __m128i vNegInf = _mm_set1_epi16(NEG_INF_16);
    __m128i vMaxH = vZero;
#ifdef PARASAIL_TABLE
    parasail_result_t *result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    parasail_result_t *result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
    const int32_t offset = segLen - 1;
    const int32_t position = s1Len % segWidth;
#else
    parasail_result_t *result = parasail_result_new();
#endif
#endif

    /* Generate query profile.
     * Rearrange query sequence & calculate the weight of match/mismatch.
     * Don't alias. */
    {
        int32_t index = 0;
        for (k=0; k<n; ++k) {
            for (i=0; i<segLen; ++i) {
                __m128i_16_t t;
                j = i*segWidth;
                for (segNum=0; segNum<segWidth; ++segNum) {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[matrix->size*matrix->mapper[(unsigned char)s1[j]]];
                    j += 1;
                }
                _mm_store_si128(&vProfile[index], t.m);
                ++index;
            }
        }
    }

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                h.v[segNum] = 0;
                e.v[segNum] = -open;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vX = vZero;
        __m128i vF = vNegInf;
        const __m128i* pvP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        for (i=0; i<segLen; ++i) {
            __m128i vP;
            __m128i vH;
            __m128i vE;
            __m128i vT1;

            vH = _mm_load_si128(pvH + i);
            vE = _mm_load_si128(pvE + i);

            vT1 = _mm_srli_si128(vH, 14); /* rshift 3 */
            vH = _mm_slli_si128(vH, 2); /* lshift 1 */
            vH = _mm_or_si128(vH, vX);
            vX = vT1;

            vP = _mm_load_si128(pvP + i);
            vH = _mm_add_epi16(vH, vP);
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vZero);

            vF = _mm_srli_si128(vF, 14);
            vF = _mm_or_si128(vF, _mm_slli_si128(vH, 2));
            vF = _mm_sub_epi16(vF, vGapO);
            if (_mm_movemask_epi8(_mm_cmpgt_epi16(vF, vZero))) {
                __m128i vT2 = vF;
                while (_mm_movemask_epi8(_mm_cmpgt_epi16(vT2, vZero))) {
                    vT2 = _mm_slli_si128(vT2, 2);
                    vT2 = _mm_sub_epi16(vT2, vGapE);
                    vF = _mm_max_epi16(vF, vT2);
                }
                vH = _mm_max_epi16(vH, vF);
                vF = _mm_add_epi16(vF, vGapO);
                vF = _mm_sub_epi16(vF, vGapE);
                vF = _mm_max_epi16(vH, vF);
            }
            else {
                vF = vH;
            }

            _mm_store_si128(pvH + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segWidth, j, s2Len);
#endif
            vMaxH = _mm_max_epi16(vMaxH, vH);

            vH = _mm_sub_epi16(vH, vGapO);
            vE = _mm_sub_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segWidth);
    }
#endif

    /* max in vec */
    for (j=0; j<segWidth; ++j) {
        int16_t value = (int16_t) _mm_extract_epi16(vMaxH, 7);
        if (value > score) {
            score = value;
        }
        vMaxH = _mm_slli_si128(vMaxH, 2);
    }

    result->score = score;
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_BLOCKED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    parasail_free(pvE);
    parasail_free(pvH);
    parasail_free(vProfile);

    return result;
}